

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alice.cpp
# Opt level: O1

void __thiscall Alice::LoadAlphaRandoms(Alice *this)

{
  istream_type local_288 [8];
  ifstream fin;
  istream_iterator<long,_char,_std::char_traits<char>,_long> local_80;
  istream_iterator<long,_char,_std::char_traits<char>,_long> local_68;
  undefined1 auStack_50 [8];
  istream_iterator<long,_char,_std::char_traits<char>,_long> start;
  vector<long,_std::allocator<long>_> numbers;
  
  std::ifstream::ifstream(local_288,"../randoms/alice/AlphaRandoms_A.txt",_S_in);
  start._M_value._0_1_ = 1;
  auStack_50 = (undefined1  [8])local_288;
  std::istream_iterator<long,_char,_std::char_traits<char>,_long>::_M_read
            ((istream_iterator<long,_char,_std::char_traits<char>,_long> *)auStack_50);
  local_80._M_stream = (istream_type *)auStack_50;
  local_80._M_value = (long)start._M_stream;
  local_80._M_ok = (bool)(undefined1)start._M_value;
  local_68._M_stream = (istream_type *)0x0;
  local_68._M_value = 0;
  local_68._M_ok = false;
  std::vector<long,std::allocator<long>>::
  vector<std::istream_iterator<long,char,std::char_traits<char>,long>,void>
            ((vector<long,std::allocator<long>> *)&start._M_ok,&local_80,&local_68,
             (allocator_type *)
             ((long)&numbers.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::vector<long,std::allocator<long>>::
  _M_assign_aux<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>>
            ((vector<long,std::allocator<long>> *)&(this->super_Party).AlphaRandoms,start._16_8_,
             numbers.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
             ._M_start);
  std::ifstream::close();
  if (start._16_8_ != 0) {
    operator_delete((void *)start._16_8_,
                    (long)numbers.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_finish - start._16_8_);
  }
  std::ifstream::~ifstream(local_288);
  return;
}

Assistant:

void Alice::LoadAlphaRandoms()
{
    std::ifstream fin("../randoms/alice/AlphaRandoms_A.txt");
    std::istream_iterator<long> start(fin), end;
    std::vector<long> numbers(start, end);
    AlphaRandoms.assign(numbers.begin(), numbers.end());
    fin.close();
}